

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprFor * AnalyzeForEach(ExpressionContext *ctx,SynForEach *syntax)

{
  uint uVar1;
  SynBase *pSVar2;
  TypeBase *pTVar3;
  IntrusiveList<ExprBase> expressions;
  IntrusiveList<ExprBase> expressions_00;
  IntrusiveList<ExprBase> expressions_01;
  IntrusiveList<TypeHandle> generics;
  IntrusiveList<TypeHandle> generics_00;
  IntrusiveList<TypeHandle> generics_01;
  bool bVar4;
  uint offset;
  uint uVar5;
  ExprVariableAccess *this;
  ExprIntegerLiteral *this_00;
  ExprBase *rhs;
  ExprPreModify *this_01;
  SynIdentifier *pSVar6;
  ExprBase *pEVar7;
  ExprVariableDefinition *pEVar8;
  VariableHandle *pVVar9;
  ExprFunctionAccess *arg0;
  VariableData *pVVar10;
  TypeRef *pTVar11;
  ExprDereference *pEVar12;
  ExprUnaryOp *this_02;
  VariableData **ppVVar13;
  ExprBlock *this_03;
  ExprBlock *this_04;
  ExprBlock *this_05;
  SynBase *pSVar14;
  FunctionData *onwerFunction;
  ExprFor *this_06;
  TypeHandle *pTVar15;
  InplaceStr name;
  ArrayView<ArgumentData> arguments_00;
  InplaceStr name_00;
  InplaceStr name_01;
  ExprBase *body;
  ExprBase *increment;
  ExprBase *curr_1;
  ExprBase *condition;
  ExprBase *initializer;
  VariableData *pVStack_328;
  uint i;
  VariableData *variable_2;
  SynBase *pSStack_318;
  uint variableOffset_2;
  char *pcStack_310;
  IntrusiveList<TypeHandle> local_300;
  InplaceStr local_2f0;
  ExprBase *local_2e0;
  ExprBase *call_2;
  InplaceStr local_2c8;
  ExprBase *local_2b8;
  ExprBase *iteratorInitializer;
  VariableData *iterator_1;
  TypeHandle *local_2a0;
  ExprDereference *local_298;
  ExprBase *call_1;
  IntrusiveList<TypeHandle> local_280;
  ExprDereference *local_270;
  ExprBase *call;
  VariableData *variable_1;
  SynBase *pSStack_258;
  uint variableOffset_1;
  char *pcStack_250;
  InplaceStr local_248;
  ExprFunctionAccess *local_238;
  ExprFunctionAccess *access;
  ExprBase *funcPtrInitializer;
  VariableData *functPtr;
  TypeHandle *local_218;
  InplaceStr local_210;
  TypeBase *local_200;
  ExprBase *startCall;
  TypeFunction *functionType;
  ExprDereference *node_2;
  undefined4 local_1e0;
  ExprBase *local_1d8;
  ExprBase *arrayIndex;
  undefined1 local_1a0 [8];
  SmallArray<ArgumentData,_1U> arguments;
  VariableData *variable;
  uint variableOffset;
  InplaceStr local_130;
  ExprBase *local_120;
  ExprBase *iteratorAssignment;
  VariableData *iterator;
  ExprBase *definition;
  ExprBase *assignment;
  VariableData *storage;
  ExprDereference *node_1;
  ExprVariableAccess *node;
  ExprBase *wrapped;
  TypeUnsizedArray *valueType_1;
  TypeArray *valueType;
  TypeBase *type;
  ExprBase *value;
  SynBase *local_b0;
  SynBase *sourceInternal;
  SynForEachIterator *curr;
  SmallArray<VariableData_*,_4U> iterators;
  IntrusiveList<ExprBase> increments;
  IntrusiveList<ExprBase> definitions;
  IntrusiveList<ExprBase> conditions;
  IntrusiveList<ExprBase> initializers;
  SynForEach *syntax_local;
  ExpressionContext *ctx_local;
  
  ExpressionContext::PushLoopScope(ctx,true,true);
  IntrusiveList<ExprBase>::IntrusiveList((IntrusiveList<ExprBase> *)&conditions.tail);
  IntrusiveList<ExprBase>::IntrusiveList((IntrusiveList<ExprBase> *)&definitions.tail);
  IntrusiveList<ExprBase>::IntrusiveList((IntrusiveList<ExprBase> *)&increments.tail);
  IntrusiveList<ExprBase>::IntrusiveList((IntrusiveList<ExprBase> *)&iterators.allocator);
  SmallArray<VariableData_*,_4U>::SmallArray((SmallArray<VariableData_*,_4U> *)&curr,ctx->allocator)
  ;
  sourceInternal = &((syntax->iterators).head)->super_SynBase;
  do {
    if (sourceInternal == (SynBase *)0x0) {
      for (initializer._4_4_ = 0;
          uVar5 = SmallArray<VariableData_*,_4U>::size((SmallArray<VariableData_*,_4U> *)&curr),
          initializer._4_4_ < uVar5; initializer._4_4_ = initializer._4_4_ + 1) {
        ppVVar13 = SmallArray<VariableData_*,_4U>::operator[]
                             ((SmallArray<VariableData_*,_4U> *)&curr,initializer._4_4_);
        ExpressionContext::AddVariable(ctx,*ppVVar13,true);
      }
      this_03 = ExpressionContext::get<ExprBlock>(ctx);
      expressions_01.tail = initializers.head;
      expressions_01.head = conditions.tail;
      ExprBlock::ExprBlock
                (this_03,&syntax->super_SynBase,ctx->typeVoid,expressions_01,(ExprBase *)0x0);
      curr_1 = (ExprBase *)0x0;
      for (increment = definitions.tail; increment != (ExprBase *)0x0; increment = increment->next)
      {
        if (curr_1 == (ExprBase *)0x0) {
          curr_1 = increment;
        }
        else {
          curr_1 = CreateBinaryOp(ctx,&syntax->super_SynBase,SYN_BINARY_OP_LOGICAL_AND,curr_1,
                                  increment);
        }
      }
      this_04 = ExpressionContext::get<ExprBlock>(ctx);
      expressions_00.tail = increments.head;
      expressions_00.head = (ExprBase *)iterators.allocator;
      ExprBlock::ExprBlock
                (this_04,&syntax->super_SynBase,ctx->typeVoid,expressions_00,(ExprBase *)0x0);
      if (syntax->body != (SynBase *)0x0) {
        pEVar7 = AnalyzeStatement(ctx,syntax->body);
        IntrusiveList<ExprBase>::push_back((IntrusiveList<ExprBase> *)&increments.tail,pEVar7);
      }
      this_05 = ExpressionContext::get<ExprBlock>(ctx);
      pTVar3 = ctx->typeVoid;
      pSVar14 = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
      onwerFunction = ExpressionContext::GetCurrentFunction(ctx,ctx->scope);
      pEVar7 = CreateBlockUpvalueClose(ctx,pSVar14,onwerFunction,ctx->scope);
      expressions.tail = definitions.head;
      expressions.head = increments.tail;
      ExprBlock::ExprBlock(this_05,&syntax->super_SynBase,pTVar3,expressions,pEVar7);
      ExpressionContext::PopScope(ctx,SCOPE_LOOP);
      this_06 = ExpressionContext::get<ExprFor>(ctx);
      ExprFor::ExprFor(this_06,&syntax->super_SynBase,ctx->typeVoid,&this_03->super_ExprBase,curr_1,
                       &this_04->super_ExprBase,&this_05->super_ExprBase);
      SmallArray<VariableData_*,_4U>::~SmallArray((SmallArray<VariableData_*,_4U> *)&curr);
      return this_06;
    }
    local_b0 = &ExpressionContext::MakeInternal(ctx,sourceInternal)->super_SynBase;
    type = (TypeBase *)AnalyzeExpression(ctx,(SynBase *)sourceInternal[1].begin);
    bVar4 = isType<TypeError>((TypeBase *)(type->name).end);
    if (bVar4) {
      IntrusiveList<ExprBase>::push_back
                ((IntrusiveList<ExprBase> *)&conditions.tail,(ExprBase *)type);
    }
    else {
      valueType = (TypeArray *)0x0;
      if (sourceInternal[1]._vptr_SynBase != (_func_int **)0x0) {
        valueType = (TypeArray *)
                    AnalyzeType(ctx,(SynBase *)sourceInternal[1]._vptr_SynBase,true,(bool *)0x0);
      }
      bVar4 = isType<TypeError>(&valueType->super_TypeBase);
      if (bVar4) {
        IntrusiveList<ExprBase>::push_back
                  ((IntrusiveList<ExprBase> *)&conditions.tail,(ExprBase *)type);
      }
      else {
        bVar4 = isType<TypeArray>((TypeBase *)(type->name).end);
        if ((bVar4) || (bVar4 = isType<TypeUnsizedArray>((TypeBase *)(type->name).end), bVar4)) {
          if ((valueType == (TypeArray *)0x0) || (valueType == (TypeArray *)ctx->typeAuto)) {
            valueType_1 = (TypeUnsizedArray *)getType<TypeArray>((TypeBase *)(type->name).end);
            if (valueType_1 == (TypeUnsizedArray *)0x0) {
              wrapped = (ExprBase *)getType<TypeUnsizedArray>((TypeBase *)(type->name).end);
              if ((TypeUnsizedArray *)wrapped != (TypeUnsizedArray *)0x0) {
                valueType = (TypeArray *)((TypeUnsizedArray *)wrapped)->subType;
              }
            }
            else {
              valueType = (TypeArray *)(valueType_1->super_TypeStruct).typeScope;
            }
          }
          node = (ExprVariableAccess *)type;
          node_1 = (ExprDereference *)getType<ExprVariableAccess>((ExprBase *)type);
          if (node_1 == (ExprDereference *)0x0) {
            storage = (VariableData *)getType<ExprDereference>((ExprBase *)type);
            if (storage == (VariableData *)0x0) {
              bVar4 = isType<TypeRef>((node->super_ExprBase).type);
              if (!bVar4) {
                assignment = (ExprBase *)
                             anon_unknown.dwarf_8df1c::AllocateTemporary
                                       (ctx,(SynBase *)(type->name).begin,
                                        (node->super_ExprBase).type);
                pSVar14 = (SynBase *)(type->name).begin;
                pEVar7 = CreateVariableAccess(ctx,pSVar14,(VariableData *)assignment,false);
                definition = CreateAssignment(ctx,pSVar14,pEVar7,(ExprBase *)type);
                pVVar10 = (VariableData *)ExpressionContext::get<ExprVariableDefinition>(ctx);
                pSVar14 = (SynBase *)(type->name).begin;
                pTVar3 = ctx->typeVoid;
                pVVar9 = ExpressionContext::get<VariableHandle>(ctx);
                VariableHandle::VariableHandle(pVVar9,(SynBase *)0x0,(VariableData *)assignment);
                ExprVariableDefinition::ExprVariableDefinition
                          ((ExprVariableDefinition *)pVVar10,pSVar14,pTVar3,pVVar9,definition);
                pSVar14 = (SynBase *)(type->name).begin;
                iterator = pVVar10;
                pEVar7 = CreateVariableAccess(ctx,pSVar14,(VariableData *)assignment,false);
                pEVar7 = CreateGetAddress(ctx,pSVar14,pEVar7);
                node = (ExprVariableAccess *)CreateSequence(ctx,pSVar14,(ExprBase *)pVVar10,pEVar7);
              }
            }
            else {
              node = *(ExprVariableAccess **)&storage->nameHash;
            }
          }
          else {
            this = (ExprVariableAccess *)ExpressionContext::get<ExprGetAddress>(ctx);
            pSVar14 = (SynBase *)(type->name).begin;
            pTVar11 = ExpressionContext::GetReferenceType(ctx,(TypeBase *)(type->name).end);
            pVVar9 = ExpressionContext::get<VariableHandle>(ctx);
            VariableHandle::VariableHandle
                      (pVVar9,(node_1->super_ExprBase).source,(VariableData *)node_1->value);
            ExprGetAddress::ExprGetAddress
                      ((ExprGetAddress *)this,pSVar14,&pTVar11->super_TypeBase,pVVar9);
            node = this;
          }
          iteratorAssignment =
               (ExprBase *)
               anon_unknown.dwarf_8df1c::AllocateTemporary(ctx,sourceInternal,ctx->typeInt);
          pSVar14 = sourceInternal;
          pEVar7 = CreateVariableAccess(ctx,sourceInternal,(VariableData *)iteratorAssignment,false)
          ;
          this_00 = ExpressionContext::get<ExprIntegerLiteral>(ctx);
          ExprIntegerLiteral::ExprIntegerLiteral(this_00,sourceInternal,ctx->typeInt,0);
          local_120 = CreateAssignment(ctx,pSVar14,pEVar7,&this_00->super_ExprBase);
          pEVar8 = ExpressionContext::get<ExprVariableDefinition>(ctx);
          pSVar14 = sourceInternal;
          pTVar3 = ctx->typeVoid;
          pVVar9 = ExpressionContext::get<VariableHandle>(ctx);
          VariableHandle::VariableHandle(pVVar9,(SynBase *)0x0,(VariableData *)iteratorAssignment);
          ExprVariableDefinition::ExprVariableDefinition(pEVar8,pSVar14,pTVar3,pVVar9,local_120);
          IntrusiveList<ExprBase>::push_back
                    ((IntrusiveList<ExprBase> *)&conditions.tail,&pEVar8->super_ExprBase);
          pSVar2 = sourceInternal;
          pEVar7 = CreateVariableAccess(ctx,sourceInternal,(VariableData *)iteratorAssignment,false)
          ;
          pTVar3 = type;
          pSVar14 = (SynBase *)sourceInternal[1].begin;
          pSVar6 = ExpressionContext::get<SynIdentifier>(ctx);
          InplaceStr::InplaceStr(&local_130,"size");
          SynIdentifier::SynIdentifier(pSVar6,local_130);
          rhs = CreateMemberAccess(ctx,pSVar14,(ExprBase *)pTVar3,pSVar6,false);
          pEVar7 = CreateBinaryOp(ctx,pSVar2,SYN_BINARY_OP_LESS,pEVar7,rhs);
          IntrusiveList<ExprBase>::push_back((IntrusiveList<ExprBase> *)&definitions.tail,pEVar7);
          valueType = (TypeArray *)
                      ExpressionContext::GetReferenceType(ctx,&valueType->super_TypeBase);
          name.end = (char *)rhs;
          name.begin = *(char **)(*(long *)&sourceInternal[1].typeID + 0x48);
          anon_unknown.dwarf_8df1c::CheckVariableConflict
                    ((anon_unknown_dwarf_8df1c *)ctx,(ExpressionContext *)sourceInternal,
                     *(SynBase **)(*(long *)&sourceInternal[1].typeID + 0x40),name);
          offset = anon_unknown.dwarf_8df1c::AllocateVariableInScope
                             (ctx,sourceInternal,(valueType->super_TypeBase).alignment,
                              &valueType->super_TypeBase);
          pVVar10 = ExpressionContext::get<VariableData>(ctx);
          uVar5 = (valueType->super_TypeBase).alignment;
          pSVar6 = *(SynIdentifier **)&sourceInternal[1].typeID;
          uVar1 = ctx->uniqueVariableId;
          ctx->uniqueVariableId = uVar1 + 1;
          VariableData::VariableData
                    (pVVar10,ctx->allocator,sourceInternal,ctx->scope,uVar5,
                     &valueType->super_TypeBase,pSVar6,offset,uVar1);
          pVVar10->isReference = true;
          arguments.allocator = (Allocator *)pVVar10;
          bVar4 = anon_unknown.dwarf_8df1c::IsLookupOnlyVariable(ctx,pVVar10);
          if (bVar4) {
            *(undefined1 *)((long)&arguments.allocator[6]._vptr_Allocator + 7) = 1;
          }
          SmallArray<VariableData_*,_4U>::push_back
                    ((SmallArray<VariableData_*,_4U> *)&curr,(VariableData **)&arguments.allocator);
          SmallArray<ArgumentData,_1U>::SmallArray
                    ((SmallArray<ArgumentData,_1U> *)local_1a0,ctx->allocator);
          pSVar14 = sourceInternal;
          pTVar3 = ctx->typeInt;
          pEVar7 = CreateVariableAccess(ctx,sourceInternal,(VariableData *)iteratorAssignment,false)
          ;
          ArgumentData::ArgumentData
                    ((ArgumentData *)&arrayIndex,pSVar14,false,(SynIdentifier *)0x0,pTVar3,pEVar7);
          SmallArray<ArgumentData,_1U>::push_back
                    ((SmallArray<ArgumentData,_1U> *)local_1a0,(ArgumentData *)&arrayIndex);
          pSVar14 = sourceInternal;
          pTVar3 = type;
          ArrayView<ArgumentData>::ArrayView<1u>
                    ((ArrayView<ArgumentData> *)&node_2,(SmallArray<ArgumentData,_1U> *)local_1a0);
          arguments_00._12_4_ = 0;
          arguments_00.data = (ArgumentData *)node_2;
          arguments_00.count = local_1e0;
          local_1d8 = CreateArrayIndex(ctx,pSVar14,(ExprBase *)pTVar3,arguments_00);
          bVar4 = isType<ExprDereference>(local_1d8);
          if (!bVar4) {
            __assert_fail("isType<ExprDereference>(arrayIndex)",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                          ,0x2c46,"ExprFor *AnalyzeForEach(ExpressionContext &, SynForEach *)");
          }
          functionType = (TypeFunction *)getType<ExprDereference>(local_1d8);
          if (functionType != (TypeFunction *)0x0) {
            local_1d8 = (ExprBase *)(functionType->super_TypeBase).size;
          }
          pEVar8 = ExpressionContext::get<ExprVariableDefinition>(ctx);
          pSVar14 = sourceInternal;
          pTVar3 = ctx->typeVoid;
          pVVar9 = ExpressionContext::get<VariableHandle>(ctx);
          VariableHandle::VariableHandle(pVVar9,(SynBase *)0x0,(VariableData *)arguments.allocator);
          pSVar2 = sourceInternal;
          pEVar7 = CreateVariableAccess
                             (ctx,sourceInternal,(VariableData *)arguments.allocator,false);
          pEVar7 = CreateAssignment(ctx,pSVar2,pEVar7,local_1d8);
          ExprVariableDefinition::ExprVariableDefinition(pEVar8,pSVar14,pTVar3,pVVar9,pEVar7);
          IntrusiveList<ExprBase>::push_back
                    ((IntrusiveList<ExprBase> *)&increments.tail,&pEVar8->super_ExprBase);
          this_01 = ExpressionContext::get<ExprPreModify>(ctx);
          pSVar14 = sourceInternal;
          pTVar3 = ctx->typeInt;
          pEVar7 = CreateVariableAccess(ctx,sourceInternal,(VariableData *)iteratorAssignment,false)
          ;
          pEVar7 = CreateGetAddress(ctx,pSVar14,pEVar7);
          ExprPreModify::ExprPreModify(this_01,pSVar14,pTVar3,pEVar7,true);
          IntrusiveList<ExprBase>::push_back
                    ((IntrusiveList<ExprBase> *)&iterators.allocator,&this_01->super_ExprBase);
          SmallArray<ArgumentData,_1U>::~SmallArray((SmallArray<ArgumentData,_1U> *)local_1a0);
        }
        else {
          bVar4 = AssertValueExpression(ctx,sourceInternal,(ExprBase *)type);
          if (bVar4) {
            startCall = (ExprBase *)getType<TypeFunction>((TypeBase *)(type->name).end);
            pSVar14 = local_b0;
            pTVar3 = type;
            local_200 = (TypeBase *)0x0;
            if ((TypeFunction *)startCall == (TypeFunction *)0x0) {
              pSVar2 = (SynBase *)sourceInternal[1].begin;
              pSVar6 = ExpressionContext::get<SynIdentifier>(ctx);
              InplaceStr::InplaceStr(&local_210,"start");
              SynIdentifier::SynIdentifier(pSVar6,local_210);
              pEVar7 = CreateMemberAccess(ctx,pSVar2,(ExprBase *)pTVar3,pSVar6,false);
              IntrusiveList<TypeHandle>::IntrusiveList((IntrusiveList<TypeHandle> *)&functPtr);
              generics_01.tail = local_218;
              generics_01.head = (TypeHandle *)functPtr;
              local_200 = (TypeBase *)
                          CreateFunctionCall(ctx,pSVar14,pEVar7,generics_01,(SynCallArgument *)0x0,
                                             false);
              bVar4 = isType<TypeError>((TypeBase *)(local_200->name).end);
              if (bVar4) {
                IntrusiveList<ExprBase>::push_back
                          ((IntrusiveList<ExprBase> *)&conditions.tail,(ExprBase *)type);
                goto LAB_001dd27e;
              }
              startCall = (ExprBase *)getType<TypeFunction>((TypeBase *)(local_200->name).end);
              if ((TypeFunction *)startCall != (TypeFunction *)0x0) {
                type = local_200;
              }
            }
            if (startCall == (ExprBase *)0x0) {
              iteratorInitializer =
                   (ExprBase *)
                   anon_unknown.dwarf_8df1c::AllocateTemporary
                             (ctx,local_b0,(TypeBase *)(local_200->name).end);
              pSVar14 = local_b0;
              pEVar7 = CreateVariableAccess(ctx,local_b0,(VariableData *)iteratorInitializer,false);
              local_2b8 = CreateAssignment(ctx,pSVar14,pEVar7,(ExprBase *)local_200);
              pEVar8 = ExpressionContext::get<ExprVariableDefinition>(ctx);
              pSVar14 = local_b0;
              pTVar3 = ctx->typeVoid;
              pVVar9 = ExpressionContext::get<VariableHandle>(ctx);
              VariableHandle::VariableHandle
                        (pVVar9,(SynBase *)0x0,(VariableData *)iteratorInitializer);
              ExprVariableDefinition::ExprVariableDefinition(pEVar8,pSVar14,pTVar3,pVVar9,local_2b8)
              ;
              IntrusiveList<ExprBase>::push_back
                        ((IntrusiveList<ExprBase> *)&conditions.tail,&pEVar8->super_ExprBase);
              pSVar2 = sourceInternal;
              pSVar14 = local_b0;
              pEVar7 = CreateVariableAccess(ctx,local_b0,(VariableData *)iteratorInitializer,false);
              pSVar6 = ExpressionContext::get<SynIdentifier>(ctx);
              InplaceStr::InplaceStr(&local_2c8,"hasnext");
              SynIdentifier::SynIdentifier(pSVar6,local_2c8);
              pEVar7 = CreateMemberAccess(ctx,pSVar14,pEVar7,pSVar6,false);
              IntrusiveList<TypeHandle>::IntrusiveList((IntrusiveList<TypeHandle> *)&call_2);
              pEVar7 = CreateFunctionCall(ctx,pSVar2,pEVar7,_call_2,(SynCallArgument *)0x0,false);
              IntrusiveList<ExprBase>::push_back
                        ((IntrusiveList<ExprBase> *)&definitions.tail,pEVar7);
              pSVar2 = sourceInternal;
              pSVar14 = local_b0;
              pEVar7 = CreateVariableAccess(ctx,local_b0,(VariableData *)iteratorInitializer,false);
              pSVar6 = ExpressionContext::get<SynIdentifier>(ctx);
              InplaceStr::InplaceStr(&local_2f0,"next");
              SynIdentifier::SynIdentifier(pSVar6,local_2f0);
              pEVar7 = CreateMemberAccess(ctx,pSVar14,pEVar7,pSVar6,false);
              IntrusiveList<TypeHandle>::IntrusiveList(&local_300);
              generics.tail = local_300.tail;
              generics.head = local_300.head;
              pTVar15 = local_300.tail;
              local_2e0 = CreateFunctionCall(ctx,pSVar2,pEVar7,generics,(SynCallArgument *)0x0,false
                                            );
              if ((valueType == (TypeArray *)0x0) || (valueType == (TypeArray *)ctx->typeAuto)) {
                valueType = (TypeArray *)local_2e0->type;
              }
              else {
                valueType = (TypeArray *)
                            ExpressionContext::GetReferenceType(ctx,&valueType->super_TypeBase);
              }
              bVar4 = isType<TypeError>(&valueType->super_TypeBase);
              if (!bVar4) {
                pSStack_318 = *(SynBase **)(*(long *)&sourceInternal[1].typeID + 0x40);
                pcStack_310 = *(char **)(*(long *)&sourceInternal[1].typeID + 0x48);
                name_01.end = (char *)pTVar15;
                name_01.begin = pcStack_310;
                anon_unknown.dwarf_8df1c::CheckVariableConflict
                          ((anon_unknown_dwarf_8df1c *)ctx,(ExpressionContext *)sourceInternal,
                           pSStack_318,name_01);
                variable_2._4_4_ =
                     anon_unknown.dwarf_8df1c::AllocateVariableInScope
                               (ctx,sourceInternal,(valueType->super_TypeBase).alignment,
                                &valueType->super_TypeBase);
                pVVar10 = ExpressionContext::get<VariableData>(ctx);
                uVar5 = (valueType->super_TypeBase).alignment;
                pSVar6 = *(SynIdentifier **)&sourceInternal[1].typeID;
                uVar1 = ctx->uniqueVariableId;
                ctx->uniqueVariableId = uVar1 + 1;
                VariableData::VariableData
                          (pVVar10,ctx->allocator,sourceInternal,ctx->scope,uVar5,
                           &valueType->super_TypeBase,pSVar6,variable_2._4_4_,uVar1);
                pVStack_328 = pVVar10;
                bVar4 = isType<TypeRef>(&valueType->super_TypeBase);
                pVStack_328->isReference = bVar4;
                bVar4 = anon_unknown.dwarf_8df1c::IsLookupOnlyVariable(ctx,pVStack_328);
                if (bVar4) {
                  pVStack_328->lookupOnly = true;
                }
                SmallArray<VariableData_*,_4U>::push_back
                          ((SmallArray<VariableData_*,_4U> *)&curr,&stack0xfffffffffffffcd8);
                pEVar8 = ExpressionContext::get<ExprVariableDefinition>(ctx);
                pSVar2 = sourceInternal;
                pTVar3 = ctx->typeVoid;
                pVVar9 = ExpressionContext::get<VariableHandle>(ctx);
                VariableHandle::VariableHandle(pVVar9,(SynBase *)0x0,pVStack_328);
                pSVar14 = local_b0;
                pEVar7 = CreateVariableAccess(ctx,local_b0,pVStack_328,false);
                pEVar7 = CreateAssignment(ctx,pSVar14,pEVar7,local_2e0);
                ExprVariableDefinition::ExprVariableDefinition(pEVar8,pSVar2,pTVar3,pVVar9,pEVar7);
                IntrusiveList<ExprBase>::push_back
                          ((IntrusiveList<ExprBase> *)&increments.tail,&pEVar8->super_ExprBase);
              }
            }
            else {
              funcPtrInitializer =
                   (ExprBase *)
                   anon_unknown.dwarf_8df1c::AllocateTemporary
                             (ctx,local_b0,(TypeBase *)(type->name).end);
              pSVar14 = local_b0;
              pEVar7 = CreateVariableAccess(ctx,local_b0,(VariableData *)funcPtrInitializer,false);
              access = (ExprFunctionAccess *)CreateAssignment(ctx,pSVar14,pEVar7,(ExprBase *)type);
              pEVar8 = ExpressionContext::get<ExprVariableDefinition>(ctx);
              pSVar14 = local_b0;
              pTVar3 = ctx->typeVoid;
              pVVar9 = ExpressionContext::get<VariableHandle>(ctx);
              VariableHandle::VariableHandle
                        (pVVar9,(SynBase *)0x0,(VariableData *)funcPtrInitializer);
              arg0 = access;
              ExprVariableDefinition::ExprVariableDefinition
                        (pEVar8,pSVar14,pTVar3,pVVar9,&access->super_ExprBase);
              IntrusiveList<ExprBase>::push_back
                        ((IntrusiveList<ExprBase> *)&conditions.tail,&pEVar8->super_ExprBase);
              local_238 = getType<ExprFunctionAccess>((ExprBase *)type);
              pSVar14 = local_b0;
              if (local_238 == (ExprFunctionAccess *)0x0) {
                InplaceStr::InplaceStr(&local_248,"__assertCoroutine");
                arg0 = (ExprFunctionAccess *)
                       CreateVariableAccess(ctx,local_b0,(VariableData *)funcPtrInitializer,false);
                pEVar7 = CreateFunctionCall1(ctx,pSVar14,local_248,(ExprBase *)arg0,false,true,true)
                ;
                IntrusiveList<ExprBase>::push_back
                          ((IntrusiveList<ExprBase> *)&conditions.tail,pEVar7);
              }
              else if ((local_238->function->coroutine & 1U) == 0) {
                anon_unknown.dwarf_8df1c::Stop
                          (ctx,sourceInternal,"ERROR: function is not a coroutine");
              }
              if ((valueType == (TypeArray *)0x0) || (valueType == (TypeArray *)ctx->typeAuto)) {
                if ((TypeBase *)startCall[2]._vptr_ExprBase == ctx->typeAuto) {
                  anon_unknown.dwarf_8df1c::Report
                            (ctx,sourceInternal,"ERROR: function type is unresolved at this point");
                  goto LAB_001dd27e;
                }
                valueType = (TypeArray *)startCall[2]._vptr_ExprBase;
              }
              pSStack_258 = *(SynBase **)(*(long *)&sourceInternal[1].typeID + 0x40);
              pcStack_250 = *(char **)(*(long *)&sourceInternal[1].typeID + 0x48);
              name_00.end = (char *)arg0;
              name_00.begin = pcStack_250;
              anon_unknown.dwarf_8df1c::CheckVariableConflict
                        ((anon_unknown_dwarf_8df1c *)ctx,(ExpressionContext *)sourceInternal,
                         pSStack_258,name_00);
              variable_1._4_4_ =
                   anon_unknown.dwarf_8df1c::AllocateVariableInScope
                             (ctx,sourceInternal,(valueType->super_TypeBase).alignment,
                              &valueType->super_TypeBase);
              pVVar10 = ExpressionContext::get<VariableData>(ctx);
              uVar5 = (valueType->super_TypeBase).alignment;
              pSVar6 = *(SynIdentifier **)&sourceInternal[1].typeID;
              uVar1 = ctx->uniqueVariableId;
              ctx->uniqueVariableId = uVar1 + 1;
              VariableData::VariableData
                        (pVVar10,ctx->allocator,sourceInternal,ctx->scope,uVar5,
                         &valueType->super_TypeBase,pSVar6,variable_1._4_4_,uVar1);
              call = (ExprBase *)pVVar10;
              bVar4 = anon_unknown.dwarf_8df1c::IsLookupOnlyVariable(ctx,pVVar10);
              if (bVar4) {
                *(undefined1 *)((long)&call[1]._vptr_ExprBase + 7) = 1;
              }
              SmallArray<VariableData_*,_4U>::push_back
                        ((SmallArray<VariableData_*,_4U> *)&curr,(VariableData **)&call);
              pSVar14 = sourceInternal;
              pEVar7 = CreateVariableAccess(ctx,local_b0,(VariableData *)funcPtrInitializer,false);
              IntrusiveList<TypeHandle>::IntrusiveList(&local_280);
              local_270 = (ExprDereference *)
                          CreateFunctionCall(ctx,pSVar14,pEVar7,local_280,(SynCallArgument *)0x0,
                                             false);
              if (local_270 != (ExprDereference *)0x0) {
                pTVar11 = ExpressionContext::GetReferenceType(ctx,&valueType->super_TypeBase);
                if (pTVar11 == (TypeRef *)(local_270->super_ExprBase).type) {
                  pEVar12 = ExpressionContext::get<ExprDereference>(ctx);
                  ExprDereference::ExprDereference
                            (pEVar12,sourceInternal,&valueType->super_TypeBase,
                             &local_270->super_ExprBase);
                  local_270 = pEVar12;
                }
                pEVar8 = ExpressionContext::get<ExprVariableDefinition>(ctx);
                pSVar14 = sourceInternal;
                pTVar3 = ctx->typeVoid;
                pVVar9 = ExpressionContext::get<VariableHandle>(ctx);
                VariableHandle::VariableHandle(pVVar9,(SynBase *)0x0,(VariableData *)call);
                pSVar2 = sourceInternal;
                pEVar7 = CreateVariableAccess(ctx,sourceInternal,(VariableData *)call,false);
                pEVar7 = CreateAssignment(ctx,pSVar2,pEVar7,&local_270->super_ExprBase);
                ExprVariableDefinition::ExprVariableDefinition(pEVar8,pSVar14,pTVar3,pVVar9,pEVar7);
                IntrusiveList<ExprBase>::push_back
                          ((IntrusiveList<ExprBase> *)&conditions.tail,&pEVar8->super_ExprBase);
              }
              this_02 = ExpressionContext::get<ExprUnaryOp>(ctx);
              pSVar14 = sourceInternal;
              pTVar3 = ctx->typeBool;
              InplaceStr::InplaceStr((InplaceStr *)&call_1,"isCoroutineReset");
              pEVar7 = CreateVariableAccess(ctx,local_b0,(VariableData *)funcPtrInitializer,false);
              pEVar7 = CreateFunctionCall1(ctx,pSVar14,_call_1,pEVar7,false,false,true);
              ExprUnaryOp::ExprUnaryOp(this_02,pSVar14,pTVar3,SYN_UNARY_OP_LOGICAL_NOT,pEVar7);
              IntrusiveList<ExprBase>::push_back
                        ((IntrusiveList<ExprBase> *)&definitions.tail,&this_02->super_ExprBase);
              pSVar14 = sourceInternal;
              pEVar7 = CreateVariableAccess(ctx,local_b0,(VariableData *)funcPtrInitializer,false);
              IntrusiveList<TypeHandle>::IntrusiveList((IntrusiveList<TypeHandle> *)&iterator_1);
              generics_00.tail = local_2a0;
              generics_00.head = (TypeHandle *)iterator_1;
              local_298 = (ExprDereference *)
                          CreateFunctionCall(ctx,pSVar14,pEVar7,generics_00,(SynCallArgument *)0x0,
                                             false);
              if (local_298 != (ExprDereference *)0x0) {
                pTVar11 = ExpressionContext::GetReferenceType(ctx,&valueType->super_TypeBase);
                if (pTVar11 == (TypeRef *)(local_298->super_ExprBase).type) {
                  pEVar12 = ExpressionContext::get<ExprDereference>(ctx);
                  ExprDereference::ExprDereference
                            (pEVar12,sourceInternal,&valueType->super_TypeBase,
                             &local_298->super_ExprBase);
                  local_298 = pEVar12;
                }
                pSVar14 = sourceInternal;
                pEVar7 = CreateVariableAccess(ctx,sourceInternal,(VariableData *)call,false);
                pEVar7 = CreateAssignment(ctx,pSVar14,pEVar7,&local_298->super_ExprBase);
                IntrusiveList<ExprBase>::push_back
                          ((IntrusiveList<ExprBase> *)&iterators.allocator,pEVar7);
              }
            }
          }
          else {
            IntrusiveList<ExprBase>::push_back
                      ((IntrusiveList<ExprBase> *)&conditions.tail,(ExprBase *)type);
          }
        }
      }
    }
LAB_001dd27e:
    sourceInternal = &getType<SynForEachIterator>(sourceInternal->next)->super_SynBase;
  } while( true );
}

Assistant:

ExprFor* AnalyzeForEach(ExpressionContext &ctx, SynForEach *syntax)
{
	ctx.PushLoopScope(true, true);

	IntrusiveList<ExprBase> initializers;
	IntrusiveList<ExprBase> conditions;
	IntrusiveList<ExprBase> definitions;
	IntrusiveList<ExprBase> increments;

	SmallArray<VariableData*, 4> iterators(ctx.allocator);

	for(SynForEachIterator *curr = syntax->iterators.head; curr; curr = getType<SynForEachIterator>(curr->next))
	{
		SynBase *sourceInternal = ctx.MakeInternal(curr);

		ExprBase *value = AnalyzeExpression(ctx, curr->value);

		if(isType<TypeError>(value->type))
		{
			initializers.push_back(value);
			continue;
		}

		TypeBase *type = NULL;

		if(curr->type)
			type = AnalyzeType(ctx, curr->type);

		if(isType<TypeError>(type))
		{
			initializers.push_back(value);
			continue;
		}

		// Special implementation of for each for built-in arrays
		if(isType<TypeArray>(value->type) || isType<TypeUnsizedArray>(value->type))
		{
			if(!type || type == ctx.typeAuto)
			{
				if(TypeArray *valueType = getType<TypeArray>(value->type))
					type = valueType->subType;
				else if(TypeUnsizedArray *valueType = getType<TypeUnsizedArray>(value->type))
					type = valueType->subType;
			}

			ExprBase* wrapped = value;

			if(ExprVariableAccess *node = getType<ExprVariableAccess>(value))
			{
				wrapped = new (ctx.get<ExprGetAddress>()) ExprGetAddress(value->source, ctx.GetReferenceType(value->type), new (ctx.get<VariableHandle>()) VariableHandle(node->source, node->variable));
			}
			else if(ExprDereference *node = getType<ExprDereference>(value))
			{
				wrapped = node->value;
			}
			else if(!isType<TypeRef>(wrapped->type))
			{
				VariableData *storage = AllocateTemporary(ctx, value->source, wrapped->type);

				ExprBase *assignment = CreateAssignment(ctx, value->source, CreateVariableAccess(ctx, value->source, storage, false), value);

				ExprBase *definition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(value->source, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, storage), assignment);

				wrapped = CreateSequence(ctx, value->source, definition, CreateGetAddress(ctx, value->source, CreateVariableAccess(ctx, value->source, storage, false)));
			}

			// Create initializer
			VariableData *iterator = AllocateTemporary(ctx, curr, ctx.typeInt);

			ExprBase *iteratorAssignment = CreateAssignment(ctx, curr, CreateVariableAccess(ctx, curr, iterator, false), new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(curr, ctx.typeInt, 0));

			initializers.push_back(new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(curr, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, iterator), iteratorAssignment));

			// Create condition
			conditions.push_back(CreateBinaryOp(ctx, curr, SYN_BINARY_OP_LESS, CreateVariableAccess(ctx, curr, iterator, false), CreateMemberAccess(ctx, curr->value, value, new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("size")), false)));

			// Create definition
			type = ctx.GetReferenceType(type);

			CheckVariableConflict(ctx, curr, curr->name->name);

			unsigned variableOffset = AllocateVariableInScope(ctx, curr, type->alignment, type);
			VariableData *variable = new (ctx.get<VariableData>()) VariableData(ctx.allocator, curr, ctx.scope, type->alignment, type, curr->name, variableOffset, ctx.uniqueVariableId++);

			variable->isReference = true;

			if (IsLookupOnlyVariable(ctx, variable))
				variable->lookupOnly = true;

			iterators.push_back(variable);

			SmallArray<ArgumentData, 1> arguments(ctx.allocator);
			arguments.push_back(ArgumentData(curr, false, NULL, ctx.typeInt, CreateVariableAccess(ctx, curr, iterator, false)));

			ExprBase *arrayIndex = CreateArrayIndex(ctx, curr, value, arguments);

			assert(isType<ExprDereference>(arrayIndex));

			if(ExprDereference *node = getType<ExprDereference>(arrayIndex))
				arrayIndex = node->value;

			definitions.push_back(new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(curr, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, variable), CreateAssignment(ctx, curr, CreateVariableAccess(ctx, curr, variable, false), arrayIndex)));

			// Create increment
			increments.push_back(new (ctx.get<ExprPreModify>()) ExprPreModify(curr, ctx.typeInt, CreateGetAddress(ctx, curr, CreateVariableAccess(ctx, curr, iterator, false)), true));
			continue;
		}

		if(!AssertValueExpression(ctx, curr, value))
		{
			initializers.push_back(value);
			continue;
		}

		TypeFunction *functionType = getType<TypeFunction>(value->type);
		ExprBase *startCall = NULL;
		
		// If we don't have a function, get an iterator
		if(!functionType)
		{
			startCall = CreateFunctionCall(ctx, sourceInternal, CreateMemberAccess(ctx, curr->value, value, new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("start")), false), IntrusiveList<TypeHandle>(), NULL, false);

			if(isType<TypeError>(startCall->type))
			{
				initializers.push_back(value);
				continue;
			}

			// Check if iteartor is a coroutine
			functionType = getType<TypeFunction>(startCall->type);

			if(functionType)
				value = startCall;
		}

		if(functionType)
		{
			// Store function pointer in a variable
			VariableData *functPtr = AllocateTemporary(ctx, sourceInternal, value->type);

			ExprBase *funcPtrInitializer = CreateAssignment(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, functPtr, false), value);

			initializers.push_back(new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(sourceInternal, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, functPtr), funcPtrInitializer));

			if(ExprFunctionAccess *access = getType<ExprFunctionAccess>(value))
			{
				if(!access->function->coroutine)
					Stop(ctx, curr, "ERROR: function is not a coroutine");
			}
			else
			{
				initializers.push_back(CreateFunctionCall1(ctx, sourceInternal, InplaceStr("__assertCoroutine"), CreateVariableAccess(ctx, sourceInternal, functPtr, false), false, true, true));
			}

			// Create definition
			if(!type || type == ctx.typeAuto)
			{
				if(functionType->returnType == ctx.typeAuto)
				{
					Report(ctx, curr, "ERROR: function type is unresolved at this point");

					continue;
				}

				type = functionType->returnType;
			}

			CheckVariableConflict(ctx, curr, curr->name->name);

			unsigned variableOffset = AllocateVariableInScope(ctx, curr, type->alignment, type);
			VariableData *variable = new (ctx.get<VariableData>()) VariableData(ctx.allocator, curr, ctx.scope, type->alignment, type, curr->name, variableOffset, ctx.uniqueVariableId++);

			if (IsLookupOnlyVariable(ctx, variable))
				variable->lookupOnly = true;

			iterators.push_back(variable);

			if(ExprBase *call = CreateFunctionCall(ctx, curr, CreateVariableAccess(ctx, sourceInternal, functPtr, false), IntrusiveList<TypeHandle>(), NULL, false))
			{
				if(ctx.GetReferenceType(type) == call->type)
					call = new (ctx.get<ExprDereference>()) ExprDereference(curr, type, call);

				initializers.push_back(new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(curr, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, variable), CreateAssignment(ctx, curr, CreateVariableAccess(ctx, curr, variable, false), call)));
			}

			// Create condition
			conditions.push_back(new (ctx.get<ExprUnaryOp>()) ExprUnaryOp(curr, ctx.typeBool, SYN_UNARY_OP_LOGICAL_NOT, CreateFunctionCall1(ctx, curr, InplaceStr("isCoroutineReset"), CreateVariableAccess(ctx, sourceInternal, functPtr, false), false, false, true)));

			// Create increment
			if(ExprBase *call = CreateFunctionCall(ctx, curr, CreateVariableAccess(ctx, sourceInternal, functPtr, false), IntrusiveList<TypeHandle>(), NULL, false))
			{
				if(ctx.GetReferenceType(type) == call->type)
					call = new (ctx.get<ExprDereference>()) ExprDereference(curr, type, call);

				increments.push_back(CreateAssignment(ctx, curr, CreateVariableAccess(ctx, curr, variable, false), call));
			}
		}
		else
		{
			// Store iterator in a variable
			VariableData *iterator = AllocateTemporary(ctx, sourceInternal, startCall->type);

			ExprBase *iteratorInitializer = CreateAssignment(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, iterator, false), startCall);
			
			initializers.push_back(new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(sourceInternal, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, iterator), iteratorInitializer));

			// Create condition
			conditions.push_back(CreateFunctionCall(ctx, curr, CreateMemberAccess(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, iterator, false), new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("hasnext")), false), IntrusiveList<TypeHandle>(), NULL, false));

			// Create definition
			ExprBase *call = CreateFunctionCall(ctx, curr, CreateMemberAccess(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, iterator, false), new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("next")), false), IntrusiveList<TypeHandle>(), NULL, false);

			if(!type || type == ctx.typeAuto)
				type = call->type;
			else
				type = ctx.GetReferenceType(type);

			if(isType<TypeError>(type))
				continue;

			CheckVariableConflict(ctx, curr, curr->name->name);

			unsigned variableOffset = AllocateVariableInScope(ctx, curr, type->alignment, type);
			VariableData *variable = new (ctx.get<VariableData>()) VariableData(ctx.allocator, curr, ctx.scope, type->alignment, type, curr->name, variableOffset, ctx.uniqueVariableId++);

			variable->isReference = isType<TypeRef>(type);

			if (IsLookupOnlyVariable(ctx, variable))
				variable->lookupOnly = true;

			iterators.push_back(variable);

			definitions.push_back(new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(curr, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, variable), CreateAssignment(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, variable, false), call)));
		}
	}

	for(unsigned i = 0; i < iterators.size(); i++)
		ctx.AddVariable(iterators[i], true);

	ExprBase *initializer = new (ctx.get<ExprBlock>()) ExprBlock(syntax, ctx.typeVoid, initializers, NULL);

	ExprBase *condition = NULL;

	for(ExprBase *curr = conditions.head; curr; curr = curr->next)
	{
		if(!condition)
			condition = curr;
		else
			condition = CreateBinaryOp(ctx, syntax, SYN_BINARY_OP_LOGICAL_AND, condition, curr);
	}

	ExprBase *increment = new (ctx.get<ExprBlock>()) ExprBlock(syntax, ctx.typeVoid, increments, NULL);

	if(syntax->body)
		definitions.push_back(AnalyzeStatement(ctx, syntax->body));

	ExprBase *body = new (ctx.get<ExprBlock>()) ExprBlock(syntax, ctx.typeVoid, definitions, CreateBlockUpvalueClose(ctx, ctx.MakeInternal(syntax), ctx.GetCurrentFunction(ctx.scope), ctx.scope));

	ctx.PopScope(SCOPE_LOOP);

	return new (ctx.get<ExprFor>()) ExprFor(syntax, ctx.typeVoid, initializer, condition, increment, body);
}